

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packed_view.h
# Opt level: O1

void __thiscall
bv::internal::packed_view<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>
::set(packed_view<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container> *this,
     size_t begin,size_t end,word_type pattern)

{
  ulong end_00;
  word_type wVar1;
  undefined1 auVar2 [16];
  sbyte sVar3;
  byte bVar4;
  word_type value;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  
  uVar7 = this->_width;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar7;
  uVar6 = 0x40 - SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x40)) % auVar2,0);
  uVar8 = (end - begin) * uVar7;
  uVar5 = uVar8 % uVar6;
  if (begin * uVar7 < uVar7 * end) {
    wVar1 = this->_field_mask;
    uVar7 = begin * uVar7;
    do {
      uVar9 = uVar5;
      if (uVar6 <= uVar8) {
        uVar9 = uVar6;
      }
      end_00 = uVar9 + uVar7;
      bVar4 = 0x40 - (-(char)uVar9 & 0x3fU);
      sVar3 = (bVar4 < 0x41) * ('@' - bVar4);
      value = (pattern * wVar1 << sVar3) >> sVar3;
      if (uVar9 == 0) {
        value = 0;
      }
      bitview<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>::set
                (&this->_bits,uVar7,end_00,value);
      uVar8 = uVar8 - uVar9;
      uVar7 = end_00;
    } while (end_00 < this->_width * end);
  }
  return;
}

Assistant:

void packed_view<C>::set(size_t begin, size_t end, word_type pattern)
        {
            size_t fields_per_word = W / width();
            size_t bits_per_word = fields_per_word * width(); // It's not useless
            size_t len = (end - begin) * width();
            size_t rem = len % bits_per_word;
            
            ensure_bitsize(pattern, width());
            
            word_type value = field_mask() * pattern;
            
            for(size_t step, p = begin * width();
                p < end * width();
                len -= step, p += step)
            {
                step = len < bits_per_word ? rem : bits_per_word;
                
                _bits.set(p, p + step, lowbits(value, step));
            }
        }